

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::JapaneseCalendar::getDefaultMonthInYear(JapaneseCalendar *this,int32_t eyear)

{
  int eraIdx;
  int32_t iVar1;
  UErrorCode status;
  int32_t eraStart [3];
  UErrorCode local_24;
  int local_20 [4];
  
  eraIdx = (*(this->super_GregorianCalendar).super_Calendar.super_UObject._vptr_UObject[0x32])();
  local_20[2] = 0;
  local_20[0] = 0;
  local_20[1] = 0;
  local_24 = U_ZERO_ERROR;
  EraRules::getStartDate(gJapaneseEraRules,eraIdx,(int32_t (*) [3])local_20,&local_24);
  iVar1 = 0;
  if (local_20[0] == eyear) {
    iVar1 = local_20[1] + -1;
  }
  return iVar1;
}

Assistant:

int32_t JapaneseCalendar::getDefaultMonthInYear(int32_t eyear) 
{
    int32_t era = internalGetEra();
    // TODO do we assume we can trust 'era'?  What if it is denormalized?

    int32_t month = 0;

    // Find out if we are at the edge of an era
    int32_t eraStart[3] = { 0,0,0 };
    UErrorCode status = U_ZERO_ERROR;
    gJapaneseEraRules->getStartDate(era, eraStart, status);
    U_ASSERT(U_SUCCESS(status));
    if(eyear == eraStart[0]) {
        // Yes, we're in the first year of this era.
        return eraStart[1]  // month
                -1;         // return 0-based month
    }

    return month;
}